

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comment_grammar.cpp
# Opt level: O0

void __thiscall franca::AnnotationGrammar::AnnotationGrammar(AnnotationGrammar *this)

{
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>
  *a0;
  expr_param e;
  expr_type local_398;
  undefined1 local_390 [8];
  type *local_388;
  expr_type local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  undefined8 local_368;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::clear>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>
  that_4;
  allocator local_331;
  string local_330;
  allocator local_2f9;
  string local_2f8;
  AnnotationGrammar *local_2d8;
  AnnotationGrammar *this_local;
  undefined1 *puStack_2c8;
  that_type that_5;
  undefined1 local_270 [8];
  that_type that;
  undefined1 local_226;
  empty_env local_225;
  int local_224;
  empty_env d;
  expr_param pbStack_220;
  empty_state s;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::spirit::attribute<0>_>_&,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_1e2;
  undefined1 local_1e1;
  data_param local_1e0;
  state_param local_1d8;
  expr_param local_1d0;
  undefined1 *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  undefined1 local_191;
  proto_child0 local_190;
  undefined1 *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  proto_child0 local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>
  that_2;
  type that_1;
  undefined1 local_108 [8];
  expr_type that_3;
  undefined1 local_8e;
  empty_env local_8d;
  int local_8c;
  empty_env d_1;
  expr_param pbStack_88;
  empty_state s_1;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::clear>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_72;
  undefined1 local_71;
  data_param local_70;
  state_param local_68;
  expr_param local_60;
  undefined1 *local_58;
  expr_param local_50;
  undefined1 *local_48;
  expr_param local_40;
  undefined1 local_31;
  proto_child0 local_30;
  undefined1 **local_28;
  long local_20;
  proto_child0 local_18;
  undefined1 *local_10;
  
  local_2d8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"unnamed-grammar",&local_2f9);
  boost::spirit::qi::
  grammar<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->
             super_grammar<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ,&this->annotation_,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_330,"unnamed-rule",&local_331);
  boost::spirit::qi::
  rule<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->annotation_,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  local_380.child0.t_ =
       (proto_child0)
       boost::phoenix::ref<std::__cxx11::string>
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  cur_dox_abi_cxx11_);
  that.child1.proto_expr_.child0.t_ = (expr_type)&local_380;
  local_270 = (undefined1  [8])&boost::spirit::_val;
  e = (expr_param)local_270;
  local_224 = 0;
  local_1c8 = &local_226;
  local_1d8 = &local_224;
  local_1e0 = &local_225;
  pbStack_220 = e;
  local_1d0 = e;
  that.child0 = (proto_child0)local_380.child0.t_;
  local_190.t_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 boost::proto::_::
                 impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::spirit::attribute<0>_>_&,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
                 ::operator()(&local_1e2,e,local_1d8,local_1e0);
  local_188 = &local_1e1;
  local_370 = (((proto_child1 *)((long)local_190.t_ + 8))->proto_expr_).child0.t_;
  local_160 = &local_191;
  local_168 = local_1a8;
  local_1b8 = local_370;
  local_1a0 = local_370;
  local_178 = local_370;
  local_170.t_ = local_190.t_;
  that_2.proto_expr_._0_8_ = local_370;
  that_2.proto_expr_.child1.proto_expr_.child0.t_ = (expr_type)(expr_type)local_190.t_;
  local_398.child0.t_ =
       (proto_child0)
       boost::phoenix::ref<std::__cxx11::string>
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  cur_dox_abi_cxx11_);
  local_388 = boost::phoenix::adl_barrier::
              clear<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::string>>,0l>>>
                        ((type *)&local_398,(adl_barrier *)e,a0);
  that_3.child1.proto_expr_.child1.proto_expr_.child0.t_ = (expr_type)local_390;
  that_3.child0.proto_expr_._0_8_ = local_370;
  pbStack_88 = (expr_param)local_108;
  local_8c = 0;
  local_58 = &local_8e;
  local_68 = &local_8c;
  local_70 = &local_8d;
  that_3.child1.proto_expr_._0_8_ = local_388;
  local_60 = pbStack_88;
  local_50 = boost::proto::_::
             impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::clear>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
             ::operator()(&local_72,pbStack_88,local_68,local_70);
  local_48 = &local_71;
  local_368 = *(undefined8 *)&(local_50->child0).proto_expr_;
  that_4.proto_expr_.child0.proto_expr_._0_8_ =
       (local_50->child0).proto_expr_.child1.proto_expr_.child0.t_;
  that_4.proto_expr_.child0.proto_expr_.child1.proto_expr_.child0.t_ =
       *(expr_type *)&(local_50->child1).proto_expr_;
  that_4.proto_expr_.child1.proto_expr_._0_8_ =
       (local_50->child1).proto_expr_.child1.proto_expr_.child0.t_;
  that_5.child1 = (proto_child1)&local_368;
  puStack_2c8 = &boost::spirit::eps;
  local_10 = &local_31;
  local_20 = (long)&this_local + 7;
  local_28 = &puStack_2c8;
  that_4.proto_expr_.child1.proto_expr_.child1.proto_expr_.child0.t_ =
       (expr_type)&boost::spirit::eps;
  local_40 = local_50;
  local_30 = (proto_child0)that_5.child1;
  local_18 = (proto_child0)that_5.child1;
  that_5.child0 = (proto_child0)that_5.child1;
  boost::spirit::qi::
  rule<char_const*,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
  ::operator=((rule<char_const*,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type,boost::spirit::unused_type>
               *)&this->annotation_,
              (expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::eps>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::clear>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0L>_>_>,_2L>_>_>,_2L>_>_&>,_2L>
               *)&that_4.proto_expr_.child1.proto_expr_.child1);
  return;
}

Assistant:

AnnotationGrammar::AnnotationGrammar():
		AnnotationGrammar::base_type(annotation_)
{
	using boost::spirit::eps;
	using boost::spirit::_val;
	namespace ph = boost::phoenix;

	annotation_ = eps[_val = ph::ref(cur_dox), ph::clear(ph::ref(cur_dox))];
}